

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::set_val_ref(Tree *this,size_t node,csubstr ref)

{
  NodeType_e NVar1;
  code *pcVar2;
  bool bVar3;
  NodeData *pNVar4;
  
  pNVar4 = _p(this,node);
  NVar1 = (pNVar4->m_type).type;
  if ((NVar1 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar1 >> 9 & 1) != 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_00231528)
              ("check failed: ! has_val_anchor(node)",0x24,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar4 = _p(this,node);
  NodeScalar::set_ref_maybe_replacing_scalar
            (&pNVar4->m_val,ref,(bool)((byte)(int)(pNVar4->m_type).type & 1));
  _add_flags(this,node,0x81);
  return;
}

Assistant:

void set_val_ref   (size_t node, csubstr ref   ) { RYML_ASSERT( ! has_val_anchor(node)); NodeData* C4_RESTRICT n = _p(node); n->m_val.set_ref_maybe_replacing_scalar(ref, n->m_type.has_val()); _add_flags(node, VAL|VALREF); }